

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O3

Id __thiscall
spv::Builder::createConstructor
          (Builder *this,Decoration precision,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *sources,Id resultTypeId)

{
  uint composite;
  uint *puVar1;
  pointer ppIVar2;
  Builder *pBVar3;
  Builder *this_00;
  uint uVar4;
  Id IVar5;
  uint uVar6;
  Op OVar7;
  uint uVar8;
  uint uVar9;
  Instruction *pIVar10;
  pointer puVar11;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  uint uVar12;
  ulong uVar13;
  ulong uVar14;
  uint col;
  uint row;
  vector<unsigned_int,_std::allocator<unsigned_int>_> constituents;
  vector<unsigned_int,_std::allocator<unsigned_int>_> swiz;
  uint local_a8;
  uint local_a4;
  uint local_a0;
  Id local_9c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_98;
  Builder *local_78;
  Decoration local_70;
  Id local_6c;
  void *local_68;
  iterator iStack_60;
  uint *local_58;
  ulong local_50;
  ulong local_48;
  Id local_3c;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_38;
  
  uVar4 = getNumTypeConstituents(this,resultTypeId);
  puVar1 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((long)(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)puVar1 == 4) {
    uVar6 = *puVar1;
    ppIVar2 = (this->module).idToInstruction.
              super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    pIVar10 = ppIVar2[uVar6];
    if (pIVar10 == (Instruction *)0x0) {
      uVar13 = 0;
    }
    else {
      uVar13 = (ulong)pIVar10->typeId;
    }
    if ((ppIVar2[uVar13]->opCode - OpTypeBool < 3) &&
       ((1 < uVar4 || (ppIVar2[resultTypeId]->opCode == OpTypeCooperativeVectorNV)))) {
      IVar5 = smearScalar(this,precision,uVar6,resultTypeId);
      return IVar5;
    }
    if (pIVar10 == (Instruction *)0x0) {
      pIVar10 = *ppIVar2;
      uVar6 = 0;
    }
    else {
      uVar6 = pIVar10->typeId;
      pIVar10 = ppIVar2[uVar6];
    }
    if ((pIVar10->opCode == OpTypeVector) &&
       (uVar6 = getNumTypeConstituents(this,uVar6), uVar4 == uVar6)) {
      uVar4 = *(sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pIVar10 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[uVar4];
      if (pIVar10 == (Instruction *)0x0) {
        IVar5 = 0;
      }
      else {
        IVar5 = pIVar10->typeId;
      }
      if (IVar5 == resultTypeId) {
        return uVar4;
      }
      __assert_fail("resultTypeId == getTypeId(sources[0])",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0xde3,
                    "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)");
    }
  }
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_6c = getScalarTypeId(this,resultTypeId);
  puVar11 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  if ((sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish == puVar11) {
    IVar5 = 0;
  }
  else {
    uVar13 = 0;
    uVar6 = 0;
    local_50 = 0;
    local_78 = this;
    local_70 = precision;
    local_3c = resultTypeId;
    local_38 = sources;
    do {
      pBVar3 = local_78;
      composite = puVar11[uVar13];
      uVar14 = (ulong)composite;
      ppIVar2 = (local_78->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (ppIVar2[uVar14] == (Instruction *)0x0) {
        OVar7 = (*ppIVar2)->opCode;
        uVar8 = 0;
        uVar12 = 0;
        uVar9 = 0;
        switch(OVar7) {
        case OpTypeBool:
        case OpTypeInt:
        case OpTypeFloat:
        case OpTypePointer:
          goto switchD_00462768_caseD_14;
        case OpTypeVector:
          goto switchD_00462768_caseD_17;
        case OpTypeMatrix:
          goto switchD_00462768_caseD_18;
        case OpTypeImage:
        case OpTypeSampler:
        case OpTypeSampledImage:
        case OpTypeArray:
        case OpTypeRuntimeArray:
        case OpTypeStruct:
        case OpTypeOpaque:
          goto switchD_00462768_caseD_19;
        default:
          goto switchD_00462768_default;
        }
      }
      uVar12 = ppIVar2[uVar14]->typeId;
      OVar7 = ppIVar2[uVar12]->opCode;
      uVar8 = uVar12;
      uVar9 = uVar12;
      switch(OVar7) {
      case OpTypeBool:
      case OpTypeInt:
      case OpTypeFloat:
      case OpTypePointer:
switchD_00462768_caseD_14:
        local_68 = (void *)CONCAT44(local_68._4_4_,composite);
        if (1 < uVar4) {
          if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,
                       (iterator)
                       local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)&local_68);
            uVar14 = local_50;
          }
          else {
            *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = composite;
            local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
            uVar14 = local_50;
          }
        }
        local_50 = uVar14;
        uVar6 = uVar6 + 1;
        break;
      case OpTypeMatrix:
switchD_00462768_caseD_18:
        local_a0 = getTypeNumColumns(local_78,uVar12);
        this_00 = local_78;
        pIVar10 = (pBVar3->module).idToInstruction.
                  super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                  _M_impl.super__Vector_impl_data._M_start[uVar14];
        if (pIVar10 == (Instruction *)0x0) {
          IVar5 = 0;
        }
        else {
          IVar5 = pIVar10->typeId;
        }
        local_48 = uVar13;
        uVar9 = getTypeNumRows(local_78,IVar5);
        uVar12 = uVar9 * local_a0 + uVar6;
        uVar8 = uVar4 - uVar6;
        if (uVar12 <= uVar4) {
          uVar8 = uVar9 * local_a0;
        }
        local_a8 = 0;
        local_a4 = 0;
        sources = local_38;
        uVar13 = local_48;
        if (uVar8 != 0) {
          uVar6 = 0;
          local_a0 = uVar12;
          do {
            uVar12 = local_a4;
            pIVar10 = (this_00->module).idToInstruction.
                      super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>.
                      _M_impl.super__Vector_impl_data._M_start[uVar14];
            IVar5 = 0;
            if (pIVar10 != (Instruction *)0x0) {
              IVar5 = pIVar10->typeId;
            }
            uVar9 = getTypeNumRows(this_00,IVar5);
            if (uVar9 <= uVar12) {
              local_a4 = 0;
              local_a8 = local_a8 + 1;
            }
            local_68 = (void *)0x0;
            iStack_60._M_current = (uint *)0x0;
            local_58 = (uint *)0x0;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,(iterator)0x0,
                       &local_a8);
            if (iStack_60._M_current == local_58) {
              std::vector<unsigned_int,std::allocator<unsigned_int>>::
              _M_realloc_insert<unsigned_int_const&>
                        ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,iStack_60,
                         &local_a4);
            }
            else {
              *iStack_60._M_current = local_a4;
              iStack_60._M_current = iStack_60._M_current + 1;
            }
            local_9c = createCompositeExtract
                                 (this_00,composite,local_6c,
                                  (vector<unsigned_int,_std::allocator<unsigned_int>_> *)&local_68);
            uVar13 = CONCAT44(extraout_var_00,local_9c);
            if (1 < uVar4) {
              if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,
                           (iterator)
                           local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_9c);
                uVar13 = local_50;
              }
              else {
                *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_9c;
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
                uVar13 = local_50;
              }
            }
            local_50 = uVar13;
            local_a4 = local_a4 + 1;
            if (local_68 != (void *)0x0) {
              operator_delete(local_68,(long)local_58 - (long)local_68);
            }
            uVar6 = uVar6 + 1;
          } while (uVar6 < uVar8);
          sources = local_38;
          uVar13 = local_48;
          uVar6 = local_a0;
          if (uVar4 < local_a0) {
            uVar6 = uVar4;
          }
        }
        break;
      case OpTypeImage:
      case OpTypeSampler:
      case OpTypeSampledImage:
      case OpTypeArray:
      case OpTypeRuntimeArray:
      case OpTypeStruct:
      case OpTypeOpaque:
        goto switchD_00462768_caseD_19;
      default:
switchD_00462768_default:
        uVar8 = uVar9;
        if (OVar7 != OpTypeCooperativeVectorNV) {
switchD_00462768_caseD_19:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                        ,0xe23,
                        "Id spv::Builder::createConstructor(Decoration, const std::vector<Id> &, Id)"
                       );
        }
      case OpTypeVector:
switchD_00462768_caseD_17:
        local_48 = uVar13;
        uVar8 = getNumTypeConstituents(local_78,uVar8);
        uVar12 = uVar4 - uVar6;
        if (uVar8 + uVar6 <= uVar4) {
          uVar12 = uVar8;
        }
        local_a8 = 0;
        sources = local_38;
        uVar13 = local_48;
        precision = local_70;
        if (uVar12 != 0) {
          do {
            local_68 = (void *)0x0;
            iStack_60._M_current = (uint *)0x0;
            local_58 = (uint *)0x0;
            std::vector<unsigned_int,std::allocator<unsigned_int>>::
            _M_realloc_insert<unsigned_int_const&>
                      ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_68,(iterator)0x0,
                       &local_a8);
            local_9c = createRvalueSwizzle(pBVar3,local_70,local_6c,composite,
                                           (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                                           &local_68);
            uVar13 = CONCAT44(extraout_var,local_9c);
            if (1 < uVar4) {
              if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_finish ==
                  local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<unsigned_int,std::allocator<unsigned_int>>::
                _M_realloc_insert<unsigned_int_const&>
                          ((vector<unsigned_int,std::allocator<unsigned_int>> *)&local_98,
                           (iterator)
                           local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_finish,&local_9c);
                uVar13 = local_50;
              }
              else {
                *local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish = local_9c;
                local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish =
                     local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish + 1;
                uVar13 = local_50;
              }
            }
            local_50 = uVar13;
            if (local_68 != (void *)0x0) {
              operator_delete(local_68,(long)local_58 - (long)local_68);
            }
            local_a8 = local_a8 + 1;
            uVar6 = uVar6 + 1;
            sources = local_38;
            uVar13 = local_48;
            precision = local_70;
          } while (local_a8 < uVar12);
        }
      }
      pBVar3 = local_78;
      if (uVar4 <= uVar6) break;
      uVar13 = (ulong)((int)uVar13 + 1);
      puVar11 = (sources->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar13 < (ulong)((long)(sources->
                                    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 2)
            );
    IVar5 = (Id)local_50;
    if ((local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish !=
         local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start) &&
       (IVar5 = createCompositeConstruct(local_78,local_3c,&local_98),
       IVar5 != 0 && precision != DecorationMax)) {
      addDecoration(pBVar3,IVar5,precision,-1);
    }
  }
  if (local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                    .super__Vector_impl_data._M_start,
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  return IVar5;
}

Assistant:

Id Builder::createConstructor(Decoration precision, const std::vector<Id>& sources, Id resultTypeId)
{
    Id result = NoResult;
    unsigned int numTargetComponents = getNumTypeComponents(resultTypeId);
    unsigned int targetComponent = 0;

    // Special case: when calling a vector constructor with a single scalar
    // argument, smear the scalar
    if (sources.size() == 1 && isScalar(sources[0]) && (numTargetComponents > 1 || isCooperativeVectorType(resultTypeId)))
        return smearScalar(precision, sources[0], resultTypeId);

    // Special case: 2 vectors of equal size
    if (sources.size() == 1 && isVector(sources[0]) && numTargetComponents == getNumComponents(sources[0])) {
        assert(resultTypeId == getTypeId(sources[0]));
        return sources[0];
    }

    // accumulate the arguments for OpCompositeConstruct
    std::vector<Id> constituents;
    Id scalarTypeId = getScalarTypeId(resultTypeId);

    // lambda to store the result of visiting an argument component
    const auto latchResult = [&](Id comp) {
        if (numTargetComponents > 1)
            constituents.push_back(comp);
        else
            result = comp;
        ++targetComponent;
    };

    // lambda to visit a vector argument's components
    const auto accumulateVectorConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumComponents(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            std::vector<unsigned> swiz;
            swiz.push_back(s);
            latchResult(createRvalueSwizzle(precision, scalarTypeId, sourceArg, swiz));
        }
    };

    // lambda to visit a matrix argument's components
    const auto accumulateMatrixConstituents = [&](Id sourceArg) {
        unsigned int sourceSize = getNumColumns(sourceArg) * getNumRows(sourceArg);
        unsigned int sourcesToUse = sourceSize;
        if (sourcesToUse + targetComponent > numTargetComponents)
            sourcesToUse = numTargetComponents - targetComponent;

        unsigned int col = 0;
        unsigned int row = 0;
        for (unsigned int s = 0; s < sourcesToUse; ++s) {
            if (row >= getNumRows(sourceArg)) {
                row = 0;
                col++;
            }
            std::vector<Id> indexes;
            indexes.push_back(col);
            indexes.push_back(row);
            latchResult(createCompositeExtract(sourceArg, scalarTypeId, indexes));
            row++;
        }
    };

    // Go through the source arguments, each one could have either
    // a single or multiple components to contribute.
    for (unsigned int i = 0; i < sources.size(); ++i) {

        if (isScalar(sources[i]) || isPointer(sources[i]))
            latchResult(sources[i]);
        else if (isVector(sources[i]) || isCooperativeVector(sources[i]))
            accumulateVectorConstituents(sources[i]);
        else if (isMatrix(sources[i]))
            accumulateMatrixConstituents(sources[i]);
        else
            assert(0);

        if (targetComponent >= numTargetComponents)
            break;
    }

    // If the result is a vector, make it from the gathered constituents.
    if (constituents.size() > 0) {
        result = createCompositeConstruct(resultTypeId, constituents);
        return setPrecision(result, precision);
    } else {
      // Precision was set when generating this component.
      return result;
    }
}